

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long lVar1;
  void *pvVar2;
  archive_read *paVar3;
  undefined8 *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  cpio *cpio;
  ssize_t bytes_read;
  size_t in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  archive_read *a_00;
  undefined8 local_30;
  undefined4 local_4;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  if (*(long *)(lVar1 + 0x20) != 0) {
    __archive_read_consume(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(undefined8 *)(lVar1 + 0x20) = 0;
  }
  if (*(long *)(lVar1 + 0x18) < 1) {
    a_00 = *(archive_read **)(lVar1 + 0x30);
    paVar3 = (archive_read *)__archive_read_consume(a_00,in_stack_ffffffffffffffb8);
    if (a_00 == paVar3) {
      *(undefined8 *)(lVar1 + 0x30) = 0;
      *in_RSI = 0;
      *in_RDX = 0;
      *in_RCX = *(undefined8 *)(lVar1 + 0x28);
      local_4 = 1;
    }
    else {
      local_4 = -0x1e;
    }
  }
  else {
    pvVar2 = __archive_read_ahead
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ssize_t *)0x25819c);
    *in_RSI = pvVar2;
    if (local_30 < 1) {
      local_4 = -0x1e;
    }
    else {
      if (*(long *)(lVar1 + 0x18) < local_30) {
        local_30 = *(long *)(lVar1 + 0x18);
      }
      *in_RDX = local_30;
      *(long *)(lVar1 + 0x20) = local_30;
      *in_RCX = *(undefined8 *)(lVar1 + 0x28);
      *(long *)(lVar1 + 0x28) = local_30 + *(long *)(lVar1 + 0x28);
      *(long *)(lVar1 + 0x18) = *(long *)(lVar1 + 0x18) - local_30;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
archive_read_format_cpio_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct cpio *cpio;

	cpio = (struct cpio *)(a->format->data);

	if (cpio->entry_bytes_unconsumed) {
		__archive_read_consume(a, cpio->entry_bytes_unconsumed);
		cpio->entry_bytes_unconsumed = 0;
	}

	if (cpio->entry_bytes_remaining > 0) {
		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		if (bytes_read > cpio->entry_bytes_remaining)
			bytes_read = (ssize_t)cpio->entry_bytes_remaining;
		*size = bytes_read;
		cpio->entry_bytes_unconsumed = bytes_read;
		*offset = cpio->entry_offset;
		cpio->entry_offset += bytes_read;
		cpio->entry_bytes_remaining -= bytes_read;
		return (ARCHIVE_OK);
	} else {
		if (cpio->entry_padding !=
			__archive_read_consume(a, cpio->entry_padding)) {
			return (ARCHIVE_FATAL);
		}
		cpio->entry_padding = 0;
		*buff = NULL;
		*size = 0;
		*offset = cpio->entry_offset;
		return (ARCHIVE_EOF);
	}
}